

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

QMetaMethodBuilder __thiscall
QMetaObjectBuilder::addConstructor(QMetaObjectBuilder *this,QMetaMethod *prototype)

{
  Access value;
  int value_00;
  char *pcVar1;
  int __type;
  QArrayDataPointer<QByteArray> *__name;
  long in_FS_OFFSET;
  QMetaMethodBuilder QVar2;
  QMetaMethodBuilder QVar3;
  QArrayDataPointer<QByteArray> QStack_58;
  undefined1 local_40 [16];
  long local_30;
  
  __name = &QStack_58;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QMetaMethod::methodSignature((QByteArray *)&QStack_58,prototype);
  QVar2 = addConstructor(this,(QByteArray *)&QStack_58);
  local_40._0_8_ = QVar2._mobj;
  local_40._8_4_ = QVar2._index;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&QStack_58);
  pcVar1 = QMetaMethod::typeName(prototype);
  QByteArray::QByteArray((QByteArray *)&QStack_58,pcVar1,-1);
  QMetaMethodBuilder::setReturnType((QMetaMethodBuilder *)local_40,(QByteArray *)&QStack_58);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&QStack_58);
  QMetaMethod::parameterNames((QList<QByteArray> *)&QStack_58,prototype);
  QMetaMethodBuilder::setParameterNames
            ((QMetaMethodBuilder *)local_40,(QList<QByteArray> *)&QStack_58);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&QStack_58);
  pcVar1 = QMetaMethod::tag(prototype);
  QByteArray::QByteArray((QByteArray *)&QStack_58,pcVar1,-1);
  QMetaMethodBuilder::setTag((QMetaMethodBuilder *)local_40,(QByteArray *)&QStack_58);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&QStack_58);
  value = QMetaMethod::access(prototype,(char *)__name,__type);
  QMetaMethodBuilder::setAccess((QMetaMethodBuilder *)local_40,value);
  value_00 = QMetaMethod::attributes(prototype);
  QMetaMethodBuilder::setAttributes((QMetaMethodBuilder *)local_40,value_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QVar3._12_4_ = 0;
    QVar3._mobj = (QMetaObjectBuilder *)SUB128(QVar2._0_12_,0);
    QVar3._index = SUB124(QVar2._0_12_,8);
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QMetaMethodBuilder QMetaObjectBuilder::addConstructor(const QMetaMethod &prototype)
{
    Q_ASSERT(prototype.methodType() == QMetaMethod::Constructor);
    QMetaMethodBuilder ctor = addConstructor(prototype.methodSignature());
    ctor.setReturnType(prototype.typeName());
    ctor.setParameterNames(prototype.parameterNames());
    ctor.setTag(prototype.tag());
    ctor.setAccess(prototype.access());
    ctor.setAttributes(prototype.attributes());
    return ctor;
}